

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O2

int Saig_ManDemiterCheckPo(Aig_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t **ppPo0,Aig_Obj_t **ppPo1)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj0;
  
  if (((*(uint *)&pObj->field_0x18 & 7) != 3) || (iVar3 = Aig_ObjCioId(pObj), p->nTruePos <= iVar3))
  {
    __assert_fail("Saig_ObjIsPo(p, pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigMiter.c"
                  ,0x250,
                  "int Saig_ManDemiterCheckPo(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t **, Aig_Obj_t **)"
                 );
  }
  pAVar6 = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
  iVar3 = Aig_ObjIsConst1(pAVar6);
  if (iVar3 != 0) {
    if (((ulong)pObj->pFanin0 & 1) == 0) {
      return 0;
    }
    *ppPo0 = (Aig_Obj_t *)((ulong)p->pConst1 ^ 1);
    pAVar6 = (Aig_Obj_t *)((ulong)p->pConst1 ^ 1);
    goto LAB_005943d7;
  }
  if ((*(uint *)&pAVar6->field_0x18 & 7) - 7 < 0xfffffffe) {
    return 0;
  }
  iVar3 = Aig_ObjRecognizeExor(pAVar6,&pObj0,&pObj1);
  if (iVar3 == 0) {
    return 0;
  }
  pAVar6 = (Aig_Obj_t *)((ulong)pObj0 ^ 1);
  if (((ulong)pObj->pFanin0 & 1) == 0) {
    pAVar6 = pObj0;
  }
  uVar1 = *(ulong *)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x18);
  uVar4 = (uint)uVar1 & 0x30;
  if (uVar4 == 0x30) {
    return 0;
  }
  uVar2 = *(ulong *)(((ulong)pObj1 & 0xfffffffffffffffe) + 0x18);
  uVar5 = (uint)uVar2;
  if ((~uVar5 & 0x30) == 0) {
    return 0;
  }
  if ((uVar4 & uVar5) != 0) {
    return 0;
  }
  if ((uVar2 & 0x10) == 0) {
    if ((uVar1 & 0x10) == 0) {
LAB_00594479:
      if (*(int *)(((ulong)pObj1 & 0xfffffffffffffffe) + 0x24) <=
          *(int *)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x24)) goto LAB_0059448c;
    }
    *ppPo0 = pAVar6;
    pAVar6 = pObj1;
  }
  else {
    if ((uVar1 & 0x10) != 0) goto LAB_00594479;
LAB_0059448c:
    *ppPo0 = pObj1;
  }
LAB_005943d7:
  *ppPo1 = pAVar6;
  return 1;
}

Assistant:

int Saig_ManDemiterCheckPo( Aig_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t ** ppPo0, Aig_Obj_t ** ppPo1 )
{
    Aig_Obj_t * pFanin, * pObj0, * pObj1, * pObjR0, * pObjR1;
    assert( Saig_ObjIsPo(p, pObj) );
    pFanin = Aig_ObjFanin0( pObj );
    if ( Aig_ObjIsConst1(pFanin) )
    {
        if ( !Aig_ObjFaninC0(pObj) )
            return 0;
        *ppPo0 = Aig_ManConst0(p);
        *ppPo1 = Aig_ManConst0(p);
        return 1;
    }
    if ( !Aig_ObjIsNode(pFanin) )
        return 0;
    if ( !Aig_ObjRecognizeExor( pFanin, &pObj0, &pObj1 ) )
        return 0;
    if ( Aig_ObjFaninC0(pObj) )
        pObj0 = Aig_Not(pObj0);
    // make sure they can reach only one
    pObjR0 = Aig_Regular(pObj0);
    pObjR1 = Aig_Regular(pObj1);
    if ( (pObjR0->fMarkA && pObjR0->fMarkB) || (pObjR1->fMarkA && pObjR1->fMarkB) || 
         (pObjR0->fMarkA && pObjR1->fMarkA) || (pObjR0->fMarkB && pObjR1->fMarkB) )
         return 0;

    if ( pObjR1->fMarkA && !pObjR0->fMarkA )
    {
        *ppPo0 = pObj1;
        *ppPo1 = pObj0;
    }
    else if ( pObjR0->fMarkA && !pObjR1->fMarkA )
    {
        *ppPo0 = pObj0;
        *ppPo1 = pObj1;
    }
    else
    {
/*
printf( "%d", pObjR0->fMarkA );
printf( "%d", pObjR0->fMarkB );
printf( ":" );
printf( "%d", pObjR1->fMarkA );
printf( "%d", pObjR1->fMarkB );
printf( "   " );
*/
        if ( Aig_Regular(pObj0)->Id < Aig_Regular(pObj1)->Id )
        {
            *ppPo0 = pObj0;
            *ppPo1 = pObj1;
        }
        else
        {
            *ppPo0 = pObj1;
            *ppPo1 = pObj0;
        }
    }
    return 1;
}